

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O0

void ge_double_scalarmult_vartime(ge_p2 *r,uint8_t *a,ge_p3 *A,uint8_t *b)

{
  int local_90c;
  undefined1 local_908 [4];
  int i;
  ge_p3 A2;
  ge_p3 u;
  ge_p1p1 t;
  ge_cached Ai [8];
  char bslide [256];
  char aslide [256];
  uint8_t *b_local;
  ge_p3 *A_local;
  uint8_t *a_local;
  ge_p2 *r_local;
  
  slide(bslide + 0xf8,a);
  slide((char *)(Ai[7].T2d.v + 4),b);
  x25519_ge_p3_to_cached((ge_cached *)(t.T.v + 4),A);
  ge_p3_dbl((ge_p1p1 *)(u.T.v + 4),A);
  x25519_ge_p1p1_to_p3((ge_p3 *)local_908,(ge_p1p1 *)(u.T.v + 4));
  x25519_ge_add((ge_p1p1 *)(u.T.v + 4),(ge_p3 *)local_908,(ge_cached *)(t.T.v + 4));
  x25519_ge_p1p1_to_p3((ge_p3 *)(A2.T.v + 4),(ge_p1p1 *)(u.T.v + 4));
  x25519_ge_p3_to_cached((ge_cached *)(Ai[0].T2d.v + 4),(ge_p3 *)(A2.T.v + 4));
  x25519_ge_add((ge_p1p1 *)(u.T.v + 4),(ge_p3 *)local_908,(ge_cached *)(Ai[0].T2d.v + 4));
  x25519_ge_p1p1_to_p3((ge_p3 *)(A2.T.v + 4),(ge_p1p1 *)(u.T.v + 4));
  x25519_ge_p3_to_cached((ge_cached *)(Ai[1].T2d.v + 4),(ge_p3 *)(A2.T.v + 4));
  x25519_ge_add((ge_p1p1 *)(u.T.v + 4),(ge_p3 *)local_908,(ge_cached *)(Ai[1].T2d.v + 4));
  x25519_ge_p1p1_to_p3((ge_p3 *)(A2.T.v + 4),(ge_p1p1 *)(u.T.v + 4));
  x25519_ge_p3_to_cached((ge_cached *)(Ai[2].T2d.v + 4),(ge_p3 *)(A2.T.v + 4));
  x25519_ge_add((ge_p1p1 *)(u.T.v + 4),(ge_p3 *)local_908,(ge_cached *)(Ai[2].T2d.v + 4));
  x25519_ge_p1p1_to_p3((ge_p3 *)(A2.T.v + 4),(ge_p1p1 *)(u.T.v + 4));
  x25519_ge_p3_to_cached((ge_cached *)(Ai[3].T2d.v + 4),(ge_p3 *)(A2.T.v + 4));
  x25519_ge_add((ge_p1p1 *)(u.T.v + 4),(ge_p3 *)local_908,(ge_cached *)(Ai[3].T2d.v + 4));
  x25519_ge_p1p1_to_p3((ge_p3 *)(A2.T.v + 4),(ge_p1p1 *)(u.T.v + 4));
  x25519_ge_p3_to_cached((ge_cached *)(Ai[4].T2d.v + 4),(ge_p3 *)(A2.T.v + 4));
  x25519_ge_add((ge_p1p1 *)(u.T.v + 4),(ge_p3 *)local_908,(ge_cached *)(Ai[4].T2d.v + 4));
  x25519_ge_p1p1_to_p3((ge_p3 *)(A2.T.v + 4),(ge_p1p1 *)(u.T.v + 4));
  x25519_ge_p3_to_cached((ge_cached *)(Ai[5].T2d.v + 4),(ge_p3 *)(A2.T.v + 4));
  x25519_ge_add((ge_p1p1 *)(u.T.v + 4),(ge_p3 *)local_908,(ge_cached *)(Ai[5].T2d.v + 4));
  x25519_ge_p1p1_to_p3((ge_p3 *)(A2.T.v + 4),(ge_p1p1 *)(u.T.v + 4));
  x25519_ge_p3_to_cached((ge_cached *)(Ai[6].T2d.v + 4),(ge_p3 *)(A2.T.v + 4));
  ge_p2_0(r);
  local_90c = 0xff;
  while (((-1 < local_90c && (bslide[(long)local_90c + 0xf8] == '\0')) &&
         (*(char *)((long)Ai[7].T2d.v + (long)local_90c + 0x20) == '\0'))) {
    local_90c = local_90c + -1;
  }
  for (; -1 < local_90c; local_90c = local_90c + -1) {
    ge_p2_dbl((ge_p1p1 *)(u.T.v + 4),r);
    if (bslide[(long)local_90c + 0xf8] < '\x01') {
      if (bslide[(long)local_90c + 0xf8] < '\0') {
        x25519_ge_p1p1_to_p3((ge_p3 *)(A2.T.v + 4),(ge_p1p1 *)(u.T.v + 4));
        x25519_ge_sub((ge_p1p1 *)(u.T.v + 4),(ge_p3 *)(A2.T.v + 4),
                      (ge_cached *)
                      (Ai[(long)(-(int)bslide[(long)local_90c + 0xf8] / 2) + -1].T2d.v + 4));
      }
    }
    else {
      x25519_ge_p1p1_to_p3((ge_p3 *)(A2.T.v + 4),(ge_p1p1 *)(u.T.v + 4));
      x25519_ge_add((ge_p1p1 *)(u.T.v + 4),(ge_p3 *)(A2.T.v + 4),
                    (ge_cached *)
                    (Ai[(long)((int)bslide[(long)local_90c + 0xf8] / 2) + -1].T2d.v + 4));
    }
    if (*(char *)((long)Ai[7].T2d.v + (long)local_90c + 0x20) < '\x01') {
      if (*(char *)((long)Ai[7].T2d.v + (long)local_90c + 0x20) < '\0') {
        x25519_ge_p1p1_to_p3((ge_p3 *)(A2.T.v + 4),(ge_p1p1 *)(u.T.v + 4));
        ge_msub((ge_p1p1 *)(u.T.v + 4),(ge_p3 *)(A2.T.v + 4),
                Bi + -(int)*(char *)((long)Ai[7].T2d.v + (long)local_90c + 0x20) / 2);
      }
    }
    else {
      x25519_ge_p1p1_to_p3((ge_p3 *)(A2.T.v + 4),(ge_p1p1 *)(u.T.v + 4));
      ge_madd((ge_p1p1 *)(u.T.v + 4),(ge_p3 *)(A2.T.v + 4),
              Bi + (int)*(char *)((long)Ai[7].T2d.v + (long)local_90c + 0x20) / 2);
    }
    x25519_ge_p1p1_to_p2(r,(ge_p1p1 *)(u.T.v + 4));
  }
  return;
}

Assistant:

static void ge_double_scalarmult_vartime(ge_p2 *r, const uint8_t *a,
                                         const ge_p3 *A, const uint8_t *b) {
  signed char aslide[256];
  signed char bslide[256];
  ge_cached Ai[8];  // A,3A,5A,7A,9A,11A,13A,15A
  ge_p1p1 t;
  ge_p3 u;
  ge_p3 A2;
  int i;

  slide(aslide, a);
  slide(bslide, b);

  x25519_ge_p3_to_cached(&Ai[0], A);
  ge_p3_dbl(&t, A);
  x25519_ge_p1p1_to_p3(&A2, &t);
  x25519_ge_add(&t, &A2, &Ai[0]);
  x25519_ge_p1p1_to_p3(&u, &t);
  x25519_ge_p3_to_cached(&Ai[1], &u);
  x25519_ge_add(&t, &A2, &Ai[1]);
  x25519_ge_p1p1_to_p3(&u, &t);
  x25519_ge_p3_to_cached(&Ai[2], &u);
  x25519_ge_add(&t, &A2, &Ai[2]);
  x25519_ge_p1p1_to_p3(&u, &t);
  x25519_ge_p3_to_cached(&Ai[3], &u);
  x25519_ge_add(&t, &A2, &Ai[3]);
  x25519_ge_p1p1_to_p3(&u, &t);
  x25519_ge_p3_to_cached(&Ai[4], &u);
  x25519_ge_add(&t, &A2, &Ai[4]);
  x25519_ge_p1p1_to_p3(&u, &t);
  x25519_ge_p3_to_cached(&Ai[5], &u);
  x25519_ge_add(&t, &A2, &Ai[5]);
  x25519_ge_p1p1_to_p3(&u, &t);
  x25519_ge_p3_to_cached(&Ai[6], &u);
  x25519_ge_add(&t, &A2, &Ai[6]);
  x25519_ge_p1p1_to_p3(&u, &t);
  x25519_ge_p3_to_cached(&Ai[7], &u);

  ge_p2_0(r);

  for (i = 255; i >= 0; --i) {
    if (aslide[i] || bslide[i]) {
      break;
    }
  }

  for (; i >= 0; --i) {
    ge_p2_dbl(&t, r);

    if (aslide[i] > 0) {
      x25519_ge_p1p1_to_p3(&u, &t);
      x25519_ge_add(&t, &u, &Ai[aslide[i] / 2]);
    } else if (aslide[i] < 0) {
      x25519_ge_p1p1_to_p3(&u, &t);
      x25519_ge_sub(&t, &u, &Ai[(-aslide[i]) / 2]);
    }

    if (bslide[i] > 0) {
      x25519_ge_p1p1_to_p3(&u, &t);
      ge_madd(&t, &u, &Bi[bslide[i] / 2]);
    } else if (bslide[i] < 0) {
      x25519_ge_p1p1_to_p3(&u, &t);
      ge_msub(&t, &u, &Bi[(-bslide[i]) / 2]);
    }

    x25519_ge_p1p1_to_p2(r, &t);
  }
}